

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::VariablesQbSetSpeed(ChBody *this,double step)

{
  ChBodyFrame *pCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  double dVar5;
  ChVectorRef local_c8;
  ChVector<double> local_b0;
  ChVector<double> v;
  
  auVar3 = *(undefined1 (*) [16])
            (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data;
  dVar2 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
  pCVar1 = &this->super_ChBodyFrame;
  auVar4 = *(undefined1 (*) [32])
            (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data;
  ChVariables::Get_qb(&local_c8,(ChVariables *)&this->variables);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)&v,&local_c8,0,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&local_b0,
             (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
              *)&v,(type *)0x0);
  (*(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame[7])
            (pCVar1,&local_b0);
  ChVariables::Get_qb(&local_c8,(ChVariables *)&this->variables);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)&v,&local_c8,3,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&local_b0,
             (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
              *)&v,(type *)0x0);
  (*(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame[9])
            (pCVar1,&local_b0);
  ClampSpeed(this);
  ComputeGyro(this);
  if ((step != 0.0) || (NAN(step))) {
    dVar5 = 1.0 / step;
    auVar3 = vsubpd_avx(*(undefined1 (*) [16])
                         (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data,
                        auVar3);
    v.m_data[2] = dVar5 * ((this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data
                           [2] - dVar2);
    v.m_data[0] = dVar5 * auVar3._0_8_;
    v.m_data[1] = dVar5 * auVar3._8_8_;
    (*(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame[0xc]
    )(pCVar1,&v);
    auVar4 = vsubpd_avx(*(undefined1 (*) [32])
                         (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data,
                        auVar4);
    v.m_data[0] = auVar4._0_8_ * dVar5;
    v.m_data[1] = auVar4._8_8_ * dVar5;
    v.m_data[2] = auVar4._16_8_ * dVar5;
    (*(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame[0xd]
    )(pCVar1,&v);
  }
  return;
}

Assistant:

void ChBody::VariablesQbSetSpeed(double step) {
    ChCoordsys<> old_coord_dt = this->GetCoord_dt();

    // from 'qb' vector, sets body speed, and updates auxiliary data
    this->SetPos_dt(this->variables.Get_qb().segment(0, 3));
    this->SetWvel_loc(this->variables.Get_qb().segment(3, 3));

    // apply limits (if in speed clamping mode) to speeds.
    ClampSpeed();

    // compute auxiliary gyroscopic forces
    ComputeGyro();

    // Compute accel. by BDF (approximate by differentiation);
    if (step) {
        this->SetPos_dtdt((this->GetCoord_dt().pos - old_coord_dt.pos) / step);
        this->SetRot_dtdt((this->GetCoord_dt().rot - old_coord_dt.rot) / step);
    }
}